

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

Matrix<Finite> getMatrix<Finite>(string *prompt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *this;
  pointer puVar2;
  ostream *poVar3;
  runtime_error *this_00;
  Finite *extraout_RDX;
  Finite *extraout_RDX_00;
  Finite *extraout_RDX_01;
  Finite *pFVar4;
  uint uVar5;
  uint height;
  undefined8 *in_RSI;
  uint width;
  Matrix<Finite> MVar6;
  BigInteger t;
  string s;
  string sum;
  istringstream is;
  string local_268;
  string local_248;
  string *local_220;
  undefined1 *local_218;
  long local_210;
  undefined1 local_208 [16];
  BigInteger local_1f8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [32];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  local_218 = local_208;
  local_210 = 0;
  local_208[0] = 0;
  local_1d0 = local_1c0;
  local_1c8 = 0;
  local_1c0[0] = 0;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)*in_RSI,in_RSI[1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
  safeGetline((string *)local_1b0,&local_268);
  std::__cxx11::string::operator=((string *)&local_218,(string *)local_1b0);
  if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
    operator_delete((void *)local_1b0._0_8_);
  }
  local_220 = prompt;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  width = 0;
  height = 0;
  do {
    if (local_210 == 0) break;
    std::__cxx11::istringstream::istringstream((istringstream *)local_1b0);
    std::__cxx11::stringbuf::str((string *)(local_1b0 + 0x10));
    uVar5 = 0;
    BigInteger::BigInteger(&local_1f8,0);
    while( true ) {
      local_268.field_2._M_local_buf[0] = '\0';
      local_268.field_2._1_8_ = 0;
      local_268._M_dataplus._M_p = (pointer)0x0;
      local_268._M_string_length._0_1_ = 0;
      local_268._M_string_length._1_7_ = 0;
      operator>>((istream *)local_1b0,(BigInteger *)&local_268);
      Finite::Finite((Finite *)&local_248,(BigInteger *)&local_268);
      puVar2 = local_1f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_1f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_248._M_dataplus._M_p;
      local_1f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_248._M_string_length;
      local_1f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_248.field_2._M_allocated_capacity;
      local_248._M_dataplus._M_p = (pointer)0x0;
      local_248._M_string_length = 0;
      local_248.field_2._M_allocated_capacity = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        local_1f8.negative = (bool)local_248.field_2._M_local_buf[8];
      }
      else {
        operator_delete(puVar2);
        local_1f8.negative = (bool)local_248.field_2._M_local_buf[8];
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_248._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      if ((abStack_190[*(long *)(local_1b0._0_8_ + -0x18)] & 5) != 0) break;
      uVar5 = uVar5 + 1;
    }
    if (uVar5 != 0) {
      if (width != uVar5 && width != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Incorrect matrix");
        *(undefined ***)this_00 = &PTR__runtime_error_0015ed00;
        __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
      }
      paVar1 = &local_268.field_2;
      local_268._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_268,local_218,local_218 + local_210);
      std::__cxx11::string::_M_replace_aux
                ((ulong)&local_268,
                 CONCAT71(local_268._M_string_length._1_7_,(undefined1)local_268._M_string_length),0
                 ,'\x01');
      std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_268._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar1) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
      _readline(&local_268,&local_248);
      std::__cxx11::string::operator=((string *)&local_218,(string *)&local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar1) {
        operator_delete(local_268._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      height = height + 1;
      width = uVar5;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_1f8.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
  } while (uVar5 != 0);
  this = local_220;
  Matrix<Finite>::Matrix((Matrix<Finite> *)local_220,height,width);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0);
  std::__cxx11::stringbuf::str((string *)(local_1b0 + 0x10));
  Matrix<Finite>::_read_from_istream((Matrix<Finite> *)this,(istream *)local_1b0);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  pFVar4 = extraout_RDX;
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
    pFVar4 = extraout_RDX_00;
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
    pFVar4 = extraout_RDX_01;
  }
  MVar6.arr = pFVar4;
  MVar6._0_8_ = this;
  return MVar6;
}

Assistant:

Matrix<Field> getMatrix(string prompt)
{
    string s, sum;
    cout << prompt << endl;
    s = safeGetline();
    unsigned width = 0, height = 0;
    while(s.length())
    {
        istringstream is;
        is.str(s);
        unsigned cwidth = 0;
        Field dummy;
        while(is >> dummy)
            ++cwidth;
        if(!cwidth)
            break;
        if(width && width != cwidth)
            throw matrix_error("Incorrect matrix");
        width = cwidth;
        ++height;
        sum += s + ' ';
        s = _readline();
    }
    Matrix<Field> m(height, width);
    istringstream is;
    is.str(sum);
    is >> m;
    return m;
}